

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigPhase.c
# Opt level: O0

Aig_Man_t * Saig_ManPerformAbstraction(Saig_Tsim_t *pTsi,int nFrames,int fVerbose)

{
  Aig_Man_t *p;
  int iVar1;
  int iVar2;
  uint uVar3;
  Aig_Obj_t **pObjMap_00;
  Aig_Man_t *p_00;
  char *pcVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *pAVar6;
  uint *p_01;
  Aig_Obj_t *p1;
  Aig_Obj_t *local_100;
  int Value;
  int Reg;
  int f;
  int i;
  uint *pState;
  Aig_Obj_t **pObjMap;
  Aig_Obj_t *pObjNew;
  Aig_Obj_t *pObjLo;
  Aig_Obj_t *pObjLi;
  Aig_Obj_t *pObj;
  Aig_Man_t *pAig;
  Aig_Man_t *pFrames;
  int fVerbose_local;
  int nFrames_local;
  Saig_Tsim_t *pTsi_local;
  
  p = pTsi->pAig;
  iVar1 = Vec_IntSize(pTsi->vNonXRegs);
  if (iVar1 < 1) {
    __assert_fail("Vec_IntSize(pTsi->vNonXRegs) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigPhase.c"
                  ,0x2f4,"Aig_Man_t *Saig_ManPerformAbstraction(Saig_Tsim_t *, int, int)");
  }
  iVar1 = Aig_ManObjNumMax(p);
  pObjMap_00 = (Aig_Obj_t **)malloc((long)(nFrames * iVar1) << 3);
  iVar1 = Aig_ManObjNumMax(p);
  memset(pObjMap_00,0,(long)nFrames * 8 * (long)iVar1);
  iVar1 = Aig_ManObjNumMax(p);
  p_00 = Aig_ManStart(iVar1 * nFrames);
  pcVar4 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar4;
  pcVar4 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar4;
  for (Value = 0; Value < nFrames; Value = Value + 1) {
    pAVar5 = Aig_ManConst1(p);
    pAVar6 = Aig_ManConst1(p_00);
    Saig_ObjSetFrames(pObjMap_00,nFrames,pAVar5,Value,pAVar6);
  }
  for (Value = 0; Value < nFrames; Value = Value + 1) {
    Reg = 0;
    while( true ) {
      iVar1 = Aig_ManCiNum(p);
      iVar2 = Aig_ManRegNum(p);
      if (iVar1 - iVar2 <= Reg) break;
      pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(p->vCis,Reg);
      pAVar6 = Aig_ObjCreateCi(p_00);
      Saig_ObjSetFrames(pObjMap_00,nFrames,pAVar5,Value,pAVar6);
      Reg = Reg + 1;
    }
  }
  iVar1 = Aig_ManCiNum(p);
  iVar2 = Aig_ManRegNum(p);
  for (Reg = iVar1 - iVar2; iVar1 = Vec_PtrSize(p->vCis), Reg < iVar1; Reg = Reg + 1) {
    pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(p->vCis,Reg);
    pAVar6 = Aig_ObjCreateCi(p_00);
    Saig_ObjSetFrames(pObjMap_00,nFrames,pAVar5,0,pAVar6);
  }
  Value = 0;
  do {
    if (nFrames <= Value) {
      for (Value = 0; Value < nFrames; Value = Value + 1) {
        Reg = 0;
        while( true ) {
          iVar1 = Aig_ManCoNum(p);
          iVar2 = Aig_ManRegNum(p);
          if (iVar1 - iVar2 <= Reg) break;
          pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,Reg);
          pAVar6 = Saig_ObjChild0Frames(pObjMap_00,nFrames,pAVar5,Value);
          pAVar6 = Aig_ObjCreateCo(p_00,pAVar6);
          Saig_ObjSetFrames(pObjMap_00,nFrames,pAVar5,Value,pAVar6);
          Reg = Reg + 1;
        }
      }
      p_00->nRegs = p->nRegs;
      iVar1 = Aig_ManCiNum(p_00);
      iVar2 = Aig_ManRegNum(p_00);
      p_00->nTruePis = iVar1 - iVar2;
      iVar1 = Aig_ManCoNum(p_00);
      iVar2 = Aig_ManRegNum(p_00);
      p_00->nTruePos = iVar1 - iVar2;
      iVar1 = Aig_ManCoNum(p);
      iVar2 = Aig_ManRegNum(p);
      for (Reg = iVar1 - iVar2; iVar1 = Vec_PtrSize(p->vCos), Reg < iVar1; Reg = Reg + 1) {
        pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,Reg);
        pAVar6 = Saig_ObjChild0Frames(pObjMap_00,nFrames,pAVar5,nFrames + -1);
        pAVar6 = Aig_ObjCreateCo(p_00,pAVar6);
        Saig_ObjSetFrames(pObjMap_00,nFrames,pAVar5,nFrames + -1,pAVar6);
      }
      Aig_ManSeqCleanup(p_00);
      if (pObjMap_00 != (Aig_Obj_t **)0x0) {
        free(pObjMap_00);
      }
      return p_00;
    }
    for (Reg = 0; iVar1 = Vec_IntSize(pTsi->vNonXRegs), Reg < iVar1; Reg = Reg + 1) {
      iVar1 = Vec_IntEntry(pTsi->vNonXRegs,Reg);
      pAVar5 = Saig_ManLo(p,iVar1);
      p_01 = (uint *)Vec_PtrEntry(pTsi->vStates,Value);
      iVar2 = Abc_InfoHasBit(p_01,iVar1 * 2 + 1);
      uVar3 = Abc_InfoHasBit(p_01,iVar1 << 1);
      uVar3 = iVar2 << 1 | uVar3;
      if ((uVar3 != 1) && (uVar3 != 2)) {
        __assert_fail("Value == SAIG_XVS0 || Value == SAIG_XVS1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigPhase.c"
                      ,0x312,"Aig_Man_t *Saig_ManPerformAbstraction(Saig_Tsim_t *, int, int)");
      }
      if (uVar3 == 2) {
        local_100 = Aig_ManConst1(p_00);
      }
      else {
        local_100 = Aig_ManConst0(p_00);
      }
      Saig_ObjSetFrames(pObjMap_00,nFrames,pAVar5,Value,local_100);
    }
    for (Reg = 0; iVar1 = Vec_PtrSize(p->vObjs), Reg < iVar1; Reg = Reg + 1) {
      pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,Reg);
      if ((pAVar5 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsNode(pAVar5), iVar1 != 0)) {
        pAVar6 = Saig_ObjChild0Frames(pObjMap_00,nFrames,pAVar5,Value);
        p1 = Saig_ObjChild1Frames(pObjMap_00,nFrames,pAVar5,Value);
        pAVar6 = Aig_And(p_00,pAVar6,p1);
        Saig_ObjSetFrames(pObjMap_00,nFrames,pAVar5,Value,pAVar6);
      }
    }
    for (Reg = 0; iVar1 = Aig_ManRegNum(p), Reg < iVar1; Reg = Reg + 1) {
      pAVar5 = Aig_ManLi(p,Reg);
      pAVar6 = Aig_ManLo(p,Reg);
      pAVar5 = Saig_ObjChild0Frames(pObjMap_00,nFrames,pAVar5,Value);
      if (Value < nFrames + -1) {
        Saig_ObjSetFrames(pObjMap_00,nFrames,pAVar6,Value + 1,pAVar5);
      }
    }
    Value = Value + 1;
  } while( true );
}

Assistant:

Aig_Man_t * Saig_ManPerformAbstraction( Saig_Tsim_t * pTsi, int nFrames, int fVerbose )
{
    Aig_Man_t * pFrames, * pAig = pTsi->pAig;
    Aig_Obj_t * pObj, * pObjLi, * pObjLo, * pObjNew;
    Aig_Obj_t ** pObjMap;
    unsigned * pState;
    int i, f, Reg, Value;

    assert( Vec_IntSize(pTsi->vNonXRegs) > 0 );

    // create mapping for the frames nodes
    pObjMap = ABC_ALLOC( Aig_Obj_t *, nFrames * Aig_ManObjNumMax(pAig) );
    memset( pObjMap, 0, sizeof(Aig_Obj_t *) * nFrames * Aig_ManObjNumMax(pAig) );

    // start the fraig package
    pFrames = Aig_ManStart( Aig_ManObjNumMax(pAig) * nFrames );
    pFrames->pName = Abc_UtilStrsav( pAig->pName );
    pFrames->pSpec = Abc_UtilStrsav( pAig->pSpec );
    // map constant nodes
    for ( f = 0; f < nFrames; f++ )
        Saig_ObjSetFrames( pObjMap, nFrames, Aig_ManConst1(pAig), f, Aig_ManConst1(pFrames) );
    // create PI nodes for the frames
    for ( f = 0; f < nFrames; f++ )
        Aig_ManForEachPiSeq( pAig, pObj, i )
            Saig_ObjSetFrames( pObjMap, nFrames, pObj, f, Aig_ObjCreateCi(pFrames) );
    // create the latches
    Aig_ManForEachLoSeq( pAig, pObj, i )
        Saig_ObjSetFrames( pObjMap, nFrames, pObj, 0, Aig_ObjCreateCi(pFrames) );

    // add timeframes
    for ( f = 0; f < nFrames; f++ )
    {
        // replace abstracted registers by constants
        Vec_IntForEachEntry( pTsi->vNonXRegs, Reg, i )
        {
            pObj = Saig_ManLo( pAig, Reg );
            pState = (unsigned *)Vec_PtrEntry( pTsi->vStates, f );
            Value = (Abc_InfoHasBit( pState, 2 * Reg + 1 ) << 1) | Abc_InfoHasBit( pState, 2 * Reg );
            assert( Value == SAIG_XVS0 || Value == SAIG_XVS1 );
            pObjNew = (Value == SAIG_XVS1)? Aig_ManConst1(pFrames) : Aig_ManConst0(pFrames);
            Saig_ObjSetFrames( pObjMap, nFrames, pObj, f, pObjNew );
        }
        // add internal nodes of this frame
        Aig_ManForEachNode( pAig, pObj, i ) 
        {
            pObjNew = Aig_And( pFrames, Saig_ObjChild0Frames(pObjMap,nFrames,pObj,f), Saig_ObjChild1Frames(pObjMap,nFrames,pObj,f) );
            Saig_ObjSetFrames( pObjMap, nFrames, pObj, f, pObjNew );
        }
        // set the latch inputs and copy them into the latch outputs of the next frame
        Aig_ManForEachLiLoSeq( pAig, pObjLi, pObjLo, i )
        {
            pObjNew = Saig_ObjChild0Frames(pObjMap,nFrames,pObjLi,f);
            if ( f < nFrames - 1 )
                Saig_ObjSetFrames( pObjMap, nFrames, pObjLo, f+1, pObjNew );
        }
    }
    for ( f = 0; f < nFrames; f++ )
    {
        Aig_ManForEachPoSeq( pAig, pObj, i )
        {
            pObjNew = Aig_ObjCreateCo( pFrames, Saig_ObjChild0Frames(pObjMap,nFrames,pObj,f) );
            Saig_ObjSetFrames( pObjMap, nFrames, pObj, f, pObjNew );
        }
    }
    pFrames->nRegs = pAig->nRegs;
    pFrames->nTruePis = Aig_ManCiNum(pFrames) - Aig_ManRegNum(pFrames); 
    pFrames->nTruePos = Aig_ManCoNum(pFrames) - Aig_ManRegNum(pFrames); 
    Aig_ManForEachLiSeq( pAig, pObj, i )
    {
        pObjNew = Aig_ObjCreateCo( pFrames, Saig_ObjChild0Frames(pObjMap,nFrames,pObj,nFrames-1) );
        Saig_ObjSetFrames( pObjMap, nFrames, pObj, nFrames-1, pObjNew );
    }
//Aig_ManPrintStats( pFrames );
    Aig_ManSeqCleanup( pFrames );
//Aig_ManPrintStats( pFrames );
//    Aig_ManCiCleanup( pFrames );
//Aig_ManPrintStats( pFrames );
    ABC_FREE( pObjMap );
    return pFrames;
}